

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log_test.cc
# Opt level: O0

void __thiscall
leveldb::log::LogTest_UnexpectedLastType_Test::~LogTest_UnexpectedLastType_Test
          (LogTest_UnexpectedLastType_Test *this)

{
  LogTest_UnexpectedLastType_Test *this_local;
  
  ~LogTest_UnexpectedLastType_Test(this);
  operator_delete(this);
  return;
}

Assistant:

TEST_F(LogTest, UnexpectedLastType) {
  Write("foo");
  SetByte(6, kLastType);
  FixChecksum(0, 3);
  ASSERT_EQ("EOF", Read());
  ASSERT_EQ(3, DroppedBytes());
  ASSERT_EQ("OK", MatchError("missing start"));
}